

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task.cpp
# Opt level: O2

void __thiscall Task::Task(Task *this,curl_off_t start,curl_off_t end,short status)

{
  proxy local_60;
  
  (this->proxy_server).address._M_dataplus._M_p = (pointer)&(this->proxy_server).address.field_2;
  (this->proxy_server).address._M_string_length = 0;
  (this->proxy_server).address.field_2._M_local_buf[0] = '\0';
  (this->proxy_server).speed = -1;
  (this->taskThread)._M_id._M_thread = 0;
  this->task_id = global_task_id;
  global_task_id = global_task_id + 1;
  local_60.address._M_dataplus._M_p = (pointer)&local_60.address.field_2;
  local_60.address.field_2._M_allocated_capacity = 0;
  local_60.address.field_2._8_8_ = 0;
  local_60.index = 0;
  local_60._36_4_ = 0;
  local_60.address._M_string_length = 0;
  local_60.speed = -1;
  proxy::operator=(&this->proxy_server,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  this->start = start;
  this->end = end;
  this->download = 0;
  this->status = status;
  this->speed = 0;
  local_60.address._M_dataplus._M_p = (pointer)0x0;
  std::thread::operator=(&this->taskThread,(thread *)&local_60);
  std::thread::~thread((thread *)&local_60);
  return;
}

Assistant:

Task::Task(curl_off_t start, curl_off_t end, short status) {
    this->task_id = global_task_id;
    global_task_id++;
    this->proxy_server = proxy();
    this->start = start;
    this->end = end;
    download = 0;
    this->status = status;
    speed = 0;
    this->taskThread = thread();
}